

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

Pattern * __thiscall OrPattern::doAnd(OrPattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  pointer ppDVar3;
  undefined4 extraout_var_00;
  OrPattern *this_00;
  undefined8 *puVar4;
  pointer ppDVar5;
  undefined8 *puVar6;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> newlist;
  DisjointPattern *tmp;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> local_58;
  OrPattern *local_40;
  DisjointPattern *local_38;
  
  local_40 = this;
  if (b != (Pattern *)0x0) {
    lVar2 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
    local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (DisjointPattern **)0x0;
    local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (DisjointPattern **)0x0;
    if (lVar2 != 0) {
      ppDVar5 = (local_40->orlist).
                super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppDVar3 = (local_40->orlist).
                super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppDVar5 != ppDVar3) {
        puVar4 = *(undefined8 **)(lVar2 + 0x10);
        do {
          puVar6 = *(undefined8 **)(lVar2 + 8);
          if (*(undefined8 **)(lVar2 + 8) != puVar4) {
            do {
              iVar1 = (*((*ppDVar5)->super_Pattern)._vptr_Pattern[5])
                                (*ppDVar5,*puVar6,(ulong)(uint)sa);
              local_38 = (DisjointPattern *)CONCAT44(extraout_var,iVar1);
              if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::
                _M_realloc_insert<DisjointPattern*const&>
                          ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_38);
              }
              else {
                *local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_38;
                local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_58.
                     super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              puVar4 = puVar6 + 1;
              puVar6 = puVar4;
            } while (puVar4 != *(undefined8 **)(lVar2 + 0x10));
            ppDVar3 = (local_40->orlist).
                      super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          ppDVar5 = ppDVar5 + 1;
        } while (ppDVar5 != ppDVar3);
      }
      goto LAB_00332b60;
    }
  }
  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (DisjointPattern **)0x0;
  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (DisjointPattern **)0x0;
  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ppDVar5 = (local_40->orlist).
            super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppDVar5 !=
      (local_40->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar1 = (*((*ppDVar5)->super_Pattern)._vptr_Pattern[5])(*ppDVar5,b,(ulong)(uint)sa);
      local_38 = (DisjointPattern *)CONCAT44(extraout_var_00,iVar1);
      if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::
        _M_realloc_insert<DisjointPattern*const&>
                  ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_38;
        local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ppDVar5 = ppDVar5 + 1;
    } while (ppDVar5 !=
             (local_40->orlist).
             super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
LAB_00332b60:
  this_00 = (OrPattern *)operator_new(0x20);
  OrPattern(this_00,&local_58);
  if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return &this_00->super_Pattern;
}

Assistant:

Pattern *OrPattern::doAnd(const Pattern *b,int4 sa) const

{
  const OrPattern *b2 = dynamic_cast<const OrPattern *>(b);
  vector<DisjointPattern *> newlist;
  vector<DisjointPattern *>::const_iterator iter,iter2;
  DisjointPattern *tmp;
  OrPattern *tmpor;

  if (b2 == (const OrPattern *)0) {
    for(iter=orlist.begin();iter!=orlist.end();++iter) {
      tmp = (DisjointPattern *)(*iter)->doAnd(b,sa);
      newlist.push_back(tmp);
    }
  }
  else {
    for(iter=orlist.begin();iter!=orlist.end();++iter)
      for(iter2=b2->orlist.begin();iter2!=b2->orlist.end();++iter2) {
	tmp = (DisjointPattern *)(*iter)->doAnd(*iter2,sa);
	newlist.push_back(tmp);
      }
  }
  tmpor = new OrPattern(newlist);
  return tmpor;
}